

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_env_mod.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_env_mod::save(xr_level_env_mod *this,xr_writer *w)

{
  env_mod_data *v;
  uint32_t id;
  pointer ppeVar1;
  bool bVar2;
  float local_44;
  uint32_t *local_40;
  pointer local_38;
  
  local_40 = &this->m_version;
  bVar2 = this->m_version != 0;
  if (bVar2) {
    xr_writer::w_chunk<unsigned_int>(w,0,local_40);
  }
  id = (uint32_t)bVar2;
  local_38 = (this->m_env_mods).
             super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (ppeVar1 = (this->m_env_mods).
                 super__Vector_base<xray_re::env_mod_data_*,_std::allocator<xray_re::env_mod_data_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppeVar1 != local_38;
      ppeVar1 = ppeVar1 + 1) {
    v = *ppeVar1;
    xr_writer::open_chunk(w,id);
    xr_writer::w_fvector3(w,&v->position);
    local_44 = v->radius;
    (*w->_vptr_xr_writer[2])(w,&local_44,4);
    local_44 = v->power;
    (*w->_vptr_xr_writer[2])(w,&local_44,4);
    local_44 = v->far_plane;
    (*w->_vptr_xr_writer[2])(w,&local_44,4);
    xr_writer::w_fvector3(w,&v->fog_color);
    local_44 = v->fog_density;
    (*w->_vptr_xr_writer[2])(w,&local_44,4);
    xr_writer::w_fvector3(w,&v->ambient_color);
    xr_writer::w_fvector3(w,&v->sky_color);
    xr_writer::w_fvector3(w,&v->hemi_color);
    if (*local_40 != 0) {
      local_44 = (float)CONCAT22(local_44._2_2_,v->extra);
      (*w->_vptr_xr_writer[2])(w,&local_44,2);
    }
    xr_writer::close_chunk(w);
    id = id + 1;
  }
  return;
}

Assistant:

void xr_level_env_mod::save(xr_writer& w) const
{
	uint32_t id;
	if (m_version == ENV_MOD_VERSION_0) {
		id = 0;
	} else {
		id = 1;
		w.w_chunk(ENV_MOD_CHUNK_VERSION, m_version);
	}
	for (env_mod_data_vec_cit it = m_env_mods.begin(), end = m_env_mods.end();
			it != end; ++it, ++id) {
		const env_mod_data* em = *it;
		w.open_chunk(id);
		w.w_fvector3(em->position);
		w.w_float(em->radius);
		w.w_float(em->power);
		w.w_float(em->far_plane);
		w.w_fvector3(em->fog_color);
		w.w_float(em->fog_density);
		w.w_fvector3(em->ambient_color);
		w.w_fvector3(em->sky_color);
		w.w_fvector3(em->hemi_color);
		if (m_version != ENV_MOD_VERSION_0)
			w.w_u16(em->extra);
		w.close_chunk();
	}
}